

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

void __thiscall QMdiArea::closeAllSubWindows(QMdiArea *this)

{
  QMdiAreaPrivate *this_00;
  long lVar1;
  QPointer<QMdiSubWindow> *pQVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  int __fd;
  QWidget *this_01;
  long in_FS_OFFSET;
  QArrayDataPointer<QPointer<QMdiSubWindow>_> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiAreaPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  lVar1 = (this_00->childWindows).d.size;
  if (lVar1 != 0) {
    this_00->isSubWindowsTiled = false;
    local_50.d = (this_00->childWindows).d.d;
    pQVar2 = (this_00->childWindows).d.ptr;
    if (local_50.d != (Data *)0x0) {
      LOCK();
      ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_50.ptr = pQVar2;
    local_50.size = lVar1;
    for (lVar5 = 0; lVar1 * 0x10 != lVar5; lVar5 = lVar5 + 0x10) {
      lVar3 = *(long *)((long)&(pQVar2->wp).d + lVar5);
      if ((lVar3 == 0) || (*(int *)(lVar3 + 4) == 0)) {
        this_01 = (QWidget *)0x0;
      }
      else {
        this_01 = *(QWidget **)((long)&(pQVar2->wp).value + lVar5);
      }
      __fd = 0x65f8fd;
      bVar4 = sanityCheck((QMdiSubWindow *)this_01,"QMdiArea::closeAllSubWindows");
      if (bVar4) {
        QWidget::close(this_01,__fd);
      }
    }
    QMdiAreaPrivate::updateScrollBars(this_00);
    QArrayDataPointer<QPointer<QMdiSubWindow>_>::~QArrayDataPointer(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiArea::closeAllSubWindows()
{
    Q_D(QMdiArea);
    if (d->childWindows.isEmpty())
        return;

    d->isSubWindowsTiled = false;
    // Take a copy because the child->close() call below may end up indirectly calling
    // QCoreApplication::send{Spontaneous}Event(), which may call unknown code that
    // could e.g. recurse into the class modifying d->childWindows.
    const auto subWindows = d->childWindows;
    for (QMdiSubWindow *child : subWindows) {
        if (!sanityCheck(child, "QMdiArea::closeAllSubWindows"))
            continue;
        child->close();
    }

    d->updateScrollBars();
}